

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AudioDataGeneration.cpp
# Opt level: O1

Value * soul::createAudioDataObject
                  (Value *__return_storage_ptr__,ValueView *frames,double sampleRate)

{
  char *in_RCX;
  string_view className;
  string_view name;
  double local_50;
  ValueView local_48;
  
  className._M_str = in_RCX;
  className._M_len = (size_t)"soul::AudioFile";
  local_50 = sampleRate;
  choc::value::createObject(__return_storage_ptr__,(value *)0xf,className);
  choc::value::ValueView::ValueView(&local_48,frames);
  name._M_str = "frames";
  name._M_len = 6;
  choc::value::Value::addMember<choc::value::ValueView,char_const(&)[11],double&>
            (__return_storage_ptr__,name,&local_48,(char (*) [11])"sampleRate",&local_50);
  if ((char)local_48.type.mainType < '\0') {
    if (local_48.type.mainType == object) {
      if (local_48.type.content.object == (Object *)0x0) {
        return __return_storage_ptr__;
      }
      choc::value::Type::Object::~Object(local_48.type.content.object);
    }
    else {
      if (local_48.type.mainType != complexArray) {
        return __return_storage_ptr__;
      }
      if (local_48.type.content.object == (Object *)0x0) {
        return __return_storage_ptr__;
      }
      choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::
      ~AllocatedVector((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                       local_48.type.content.object);
    }
    if (local_48.type.allocator == (Allocator *)0x0) {
      free(local_48.type.content.object);
    }
    else {
      (**(code **)(*(long *)local_48.type.allocator + 0x20))
                (local_48.type.allocator,local_48.type.content.object);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

choc::value::Value createAudioDataObject (const choc::value::ValueView& frames, double sampleRate)
{
    return choc::value::createObject ("soul::AudioFile",
                                      "frames", frames,
                                      "sampleRate", sampleRate);
}